

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LinkedModelFile::LinkedModelFile(LinkedModelFile *this,LinkedModelFile *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  StringParameter *pSVar2;
  LinkedModelFile *from_local;
  LinkedModelFile *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LinkedModelFile_00d5f648;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_linkedmodelfilename(from);
  if (bVar1) {
    pSVar2 = (StringParameter *)operator_new(0x20);
    StringParameter::StringParameter(pSVar2,from->linkedmodelfilename_);
    this->linkedmodelfilename_ = pSVar2;
  }
  else {
    this->linkedmodelfilename_ = (StringParameter *)0x0;
  }
  bVar1 = has_linkedmodelsearchpath(from);
  if (bVar1) {
    pSVar2 = (StringParameter *)operator_new(0x20);
    StringParameter::StringParameter(pSVar2,from->linkedmodelsearchpath_);
    this->linkedmodelsearchpath_ = pSVar2;
  }
  else {
    this->linkedmodelsearchpath_ = (StringParameter *)0x0;
  }
  return;
}

Assistant:

LinkedModelFile::LinkedModelFile(const LinkedModelFile& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_linkedmodelfilename()) {
    linkedmodelfilename_ = new ::CoreML::Specification::StringParameter(*from.linkedmodelfilename_);
  } else {
    linkedmodelfilename_ = NULL;
  }
  if (from.has_linkedmodelsearchpath()) {
    linkedmodelsearchpath_ = new ::CoreML::Specification::StringParameter(*from.linkedmodelsearchpath_);
  } else {
    linkedmodelsearchpath_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LinkedModelFile)
}